

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Iterator * __thiscall
kj::
MappedIterable<kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
::end(Iterator *__return_storage_ptr__,
     MappedIterable<kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
     *this)

{
  kj::_::BTreeImpl::end(&__return_storage_ptr__->inner,&this->inner->impl);
  (__return_storage_ptr__->
  super_TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>).table =
       (this->super_TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>).table;
  return __return_storage_ptr__;
}

Assistant:

inline Iterator end() { return { inner.end(), (Mapping&)*this }; }